

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::SystemIdentifier::SystemIdentifier(SystemIdentifier *this)

{
  SystemIdentifier *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__SystemIdentifier_00332ae0;
  this->m_ui16SystemType = 0;
  this->m_ui16SystemName = 0;
  this->m_ui8SystemMode = '\0';
  (this->field_3).m_ui8ChangeOptions = (this->field_3).m_ui8ChangeOptions & 0xfe;
  (this->field_3).m_ui8ChangeOptions = (this->field_3).m_ui8ChangeOptions & 0xfd;
  (this->field_3).m_ui8ChangeOptions = (this->field_3).m_ui8ChangeOptions & 0xfb;
  return;
}

Assistant:

SystemIdentifier::SystemIdentifier() :
    m_ui16SystemType( 0 ),
    m_ui16SystemName( 0 ),
    m_ui8SystemMode( 0 ),
    m_ui8ChangeIndicator( 0 ),
    m_ui8AltMode4( 0 ),
    m_ui8AltModeC( 0 )
{
}